

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboCases::ResizeTest::render
          (ResizeTest *this,Context *context,Surface *dst)

{
  TextureFormatInfo *__return_storage_ptr__;
  float outputType;
  TextureFormat TVar1;
  DataType type;
  deUint32 dVar2;
  deUint32 program;
  deUint32 program_00;
  uint uVar3;
  deUint32 dVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DataTypes *pDVar8;
  FboConfig *pFVar9;
  Vector<float,_3> local_6f0;
  Vector<float,_3> local_6e4;
  Vector<float,_3> local_6d8;
  Vector<float,_3> local_6cc;
  Vector<float,_3> local_6c0;
  Vector<float,_3> local_6b4;
  Vector<float,_3> local_6a8;
  Vector<float,_3> local_69c;
  Vector<float,_4> local_690;
  Vector<float,_3> local_680;
  Vector<float,_3> local_674;
  Vector<float,_3> local_668;
  Vector<float,_3> local_65c;
  Vector<float,_4> local_650;
  Vector<float,_4> local_640;
  Vector<float,_4> local_630;
  Vec4 local_620;
  undefined1 local_610 [8];
  Framebuffer fbo;
  int newHeight;
  int newWidth;
  int initialHeight;
  int initialWidth;
  bool stencil;
  bool depth;
  deUint32 metaballsTex;
  deUint32 quadsTex;
  deUint32 flatShaderID;
  deUint32 texFromFboShaderID;
  deUint32 texToFboShaderID;
  FlatColorShader flatShader;
  Vector<float,_4> local_448;
  DataTypes local_438;
  undefined1 local_420 [8];
  Texture2DShader texFromFboShader;
  Vector<float,_4> local_274;
  DataTypes local_258;
  undefined1 local_238 [8];
  Texture2DShader texToFboShader;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormatInfo fboRangeInfo;
  DataType fboOutputType;
  TextureFormat TStack_28;
  DataType fboSamplerType;
  TextureFormat colorFormat;
  Surface *dst_local;
  Context *context_local;
  ResizeTest *this_local;
  
  colorFormat = (TextureFormat)dst;
  register0x00000000 = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  TStack_28 = register0x00000000;
  type = glu::getSampler2DType(register0x00000000);
  fboRangeInfo.lookupBias.m_data[2] =
       (float)FboTestUtil::getFragmentOutputType(&stack0xffffffffffffffd8);
  __return_storage_ptr__ = (TextureFormatInfo *)(fboOutScale.m_data + 2);
  tcu::getTextureFormatInfo(__return_storage_ptr__,&stack0xffffffffffffffd8);
  tcu::operator-((tcu *)(fboOutBias.m_data + 2),
                 (Vector<float,_4> *)(fboRangeInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)__return_storage_ptr__);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&texToFboShader.field_0x194,
             (Vector<float,_4> *)__return_storage_ptr__);
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_258);
  pDVar8 = FboTestUtil::DataTypes::operator<<(&local_258,TYPE_SAMPLER_2D);
  outputType = fboRangeInfo.lookupBias.m_data[2];
  tcu::Vector<float,_4>::Vector(&local_274,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texFromFboShader.field_0x194,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_238,pDVar8,(DataType)outputType,&local_274,
             (Vec4 *)&texFromFboShader.field_0x194);
  FboTestUtil::DataTypes::~DataTypes(&local_258);
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_438);
  pDVar8 = FboTestUtil::DataTypes::operator<<(&local_438,type);
  tcu::Vector<float,_4>::Vector(&local_448,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&flatShader.super_ShaderProgram.m_hasGeometryShader,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_420,pDVar8,TYPE_FLOAT_VEC4,&local_448,
             (Vec4 *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  FboTestUtil::DataTypes::~DataTypes(&local_438);
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)&texFromFboShaderID,(DataType)fboRangeInfo.lookupBias.m_data[2]);
  dVar2 = (*context->_vptr_Context[0x75])(context,local_238);
  program = (*context->_vptr_Context[0x75])(context,local_420);
  program_00 = (*context->_vptr_Context[0x75])(context,&texFromFboShaderID);
  uVar7 = (this->super_FboRenderCase).m_config.buffers;
  uVar3 = (this->super_FboRenderCase).m_config.buffers >> 10;
  fbo._52_4_ = 0x40;
  fbo.m_depthStencilBuffer = 0x20;
  FboTestUtil::Texture2DShader::setOutScaleBias
            ((Texture2DShader *)local_238,(Vec4 *)(fboOutBias.m_data + 2),
             (Vec4 *)&texToFboShader.field_0x194);
  FboTestUtil::Texture2DShader::setTexScaleBias
            ((Texture2DShader *)local_420,0,(Vec4 *)(fboRangeInfo.valueMax.m_data + 2),
             (Vec4 *)(fboRangeInfo.lookupScale.m_data + 2));
  createQuadsTex2D(context,1,0x1907,0x1401,0x40,0x40);
  createMetaballsTex2D(context,2,0x1907,0x1401,0x20,0x20);
  Framebuffer::Framebuffer
            ((Framebuffer *)local_610,context,&(this->super_FboRenderCase).m_config,0x80,0x80,0,0,0)
  ;
  Framebuffer::checkCompleteness((Framebuffer *)local_610);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_238,context,dVar2);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_420,context,program);
  tcu::Vector<float,_4>::Vector(&local_640,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_630,&local_640,(Vector<float,_4> *)(fboOutBias.m_data + 2));
  tcu::operator+((tcu *)&local_620,&local_630,(Vector<float,_4> *)&texToFboShader.field_0x194);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)&texFromFboShaderID,context,program_00,&local_620);
  dVar4 = Framebuffer::getFramebuffer((Framebuffer *)local_610);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar4);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  tcu::Vector<float,_4>::Vector(&local_650,0.0,0.0,0.0,1.0);
  FboTestUtil::clearColorBuffer(context,&stack0xffffffffffffffd8,&local_650);
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[6])(context,0xde1,1);
  tcu::Vector<float,_3>::Vector(&local_65c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_668,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar2,&local_65c,&local_668);
  pFVar9 = Framebuffer::getConfig((Framebuffer *)local_610);
  if (pFVar9->colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar5 = (*context->_vptr_Context[2])();
    uVar6 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar5,(ulong)uVar6);
    dVar4 = Framebuffer::getColorBuffer((Framebuffer *)local_610);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar4);
    tcu::Vector<float,_3>::Vector(&local_674,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_680,1.0,1.0,0.0);
    sglr::drawQuad(context,program,&local_674,&local_680);
    dVar4 = Framebuffer::getFramebuffer((Framebuffer *)local_610);
    (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar4);
  }
  pFVar9 = Framebuffer::getConfig((Framebuffer *)local_610);
  if (pFVar9->colorType == 0xde1) {
    dVar4 = Framebuffer::getColorBuffer((Framebuffer *)local_610);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar4);
    pFVar9 = Framebuffer::getConfig((Framebuffer *)local_610);
    (*context->_vptr_Context[0x7e])
              (context,0xde1,0,(ulong)pFVar9->colorFormat,(ulong)(uint)fbo._52_4_,
               (ulong)fbo.m_depthStencilBuffer);
  }
  else if (pFVar9->colorType == 0x8d41) {
    dVar4 = Framebuffer::getColorBuffer((Framebuffer *)local_610);
    (*context->_vptr_Context[0xc])(context,0x8d41,(ulong)dVar4);
    pFVar9 = Framebuffer::getConfig((Framebuffer *)local_610);
    (*context->_vptr_Context[0x23])
              (context,0x8d41,(ulong)pFVar9->colorFormat,(ulong)(uint)fbo._52_4_,
               (ulong)fbo.m_depthStencilBuffer);
  }
  if (((uVar7 & 0x100) != 0) || ((uVar3 & 1) != 0)) {
    pFVar9 = Framebuffer::getConfig((Framebuffer *)local_610);
    if (pFVar9->depthStencilType == 0xde1) {
      dVar4 = Framebuffer::getDepthStencilBuffer((Framebuffer *)local_610);
      (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar4);
      pFVar9 = Framebuffer::getConfig((Framebuffer *)local_610);
      (*context->_vptr_Context[0x7e])
                (context,0xde1,0,(ulong)pFVar9->depthStencilFormat,(ulong)(uint)fbo._52_4_,
                 (ulong)fbo.m_depthStencilBuffer);
    }
    else if (pFVar9->depthStencilType == 0x8d41) {
      dVar4 = Framebuffer::getDepthStencilBuffer((Framebuffer *)local_610);
      (*context->_vptr_Context[0xc])(context,0x8d41,(ulong)dVar4);
      pFVar9 = Framebuffer::getConfig((Framebuffer *)local_610);
      (*context->_vptr_Context[0x23])
                (context,0x8d41,(ulong)pFVar9->depthStencilFormat,(ulong)(uint)fbo._52_4_,
                 (ulong)fbo.m_depthStencilBuffer);
    }
  }
  (*context->_vptr_Context[5])(context,0,0,(ulong)(uint)fbo._52_4_,(ulong)fbo.m_depthStencilBuffer);
  tcu::Vector<float,_4>::Vector(&local_690,1.0,0.0,0.0,1.0);
  FboTestUtil::clearColorBuffer(context,&stack0xffffffffffffffd8,&local_690);
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[0x33])(context,0xb71);
  (*context->_vptr_Context[6])(context,0xde1,2);
  tcu::Vector<float,_3>::Vector(&local_69c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_6a8,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar2,&local_69c,&local_6a8);
  (*context->_vptr_Context[6])(context,0xde1,1);
  tcu::Vector<float,_3>::Vector(&local_6b4,0.0,0.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_6c0,1.0,1.0,1.0);
  sglr::drawQuad(context,dVar2,&local_6b4,&local_6c0);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if ((uVar3 & 1) != 0) {
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x32])(context,10,10,5,0xf);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
    tcu::Vector<float,_3>::Vector(&local_6cc,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_6d8,1.0,1.0,0.0);
    sglr::drawQuad(context,program_00,&local_6cc,&local_6d8);
    (*context->_vptr_Context[0x34])(context,0xb90);
  }
  if ((this->super_FboRenderCase).m_config.colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar7 = (*context->_vptr_Context[2])();
    uVar3 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar7,(ulong)uVar3);
    dVar2 = Framebuffer::getColorBuffer((Framebuffer *)local_610);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar2);
    tcu::Vector<float,_3>::Vector(&local_6e4,-0.5,-0.5,0.0);
    tcu::Vector<float,_3>::Vector(&local_6f0,0.5,0.5,0.0);
    sglr::drawQuad(context,program,&local_6e4,&local_6f0);
    TVar1 = colorFormat;
    uVar7 = (*context->_vptr_Context[2])();
    uVar3 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,TVar1,0,0,(ulong)uVar7,(ulong)uVar3);
  }
  else {
    FboTestUtil::readPixels
              (context,(Surface *)colorFormat,0,0,fbo._52_4_,fbo.m_depthStencilBuffer,
               &stack0xffffffffffffffd8,(Vec4 *)(fboRangeInfo.valueMax.m_data + 2),
               (Vec4 *)(fboRangeInfo.lookupScale.m_data + 2));
  }
  Framebuffer::~Framebuffer((Framebuffer *)local_610);
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)&texFromFboShaderID);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_420);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_238);
  return;
}

Assistant:

void ResizeTest::render (sglr::Context& context, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader			(fboOutputType);
	deUint32				texToFboShaderID	= context.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= context.createProgram(&texFromFboShader);
	deUint32				flatShaderID		= context.createProgram(&flatShader);

	deUint32				quadsTex			= 1;
	deUint32				metaballsTex		= 2;
	bool					depth				= (m_config.buffers & GL_DEPTH_BUFFER_BIT)		!= 0;
	bool					stencil				= (m_config.buffers & GL_STENCIL_BUFFER_BIT)	!= 0;
	int						initialWidth		= 128;
	int						initialHeight		= 128;
	int						newWidth			= 64;
	int						newHeight			= 32;

	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);

	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 32, 32);

	Framebuffer fbo(context, m_config, initialWidth, initialHeight);
	fbo.checkCompleteness();

	// Setup shaders
	texToFboShader.setUniforms	(context, texToFboShaderID);
	texFromFboShader.setUniforms(context, texFromFboShaderID);
	flatShader.setColor			(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f) * fboOutScale + fboOutBias);

	// Render quads
	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, initialWidth, initialHeight);
	clearColorBuffer(context, colorFormat, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		// Render fbo to screen
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore binding
		context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	}

	// Resize buffers
	switch (fbo.getConfig().colorType)
	{
		case GL_TEXTURE_2D:
			context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
			context.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().colorFormat, newWidth, newHeight);
			break;

		case GL_RENDERBUFFER:
			context.bindRenderbuffer(GL_RENDERBUFFER, fbo.getColorBuffer());
			context.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().colorFormat, newWidth, newHeight);
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	if (depth || stencil)
	{
		switch (fbo.getConfig().depthStencilType)
		{
			case GL_TEXTURE_2D:
				context.bindTexture(GL_TEXTURE_2D, fbo.getDepthStencilBuffer());
				context.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().depthStencilFormat, newWidth, newHeight);
				break;

			case GL_RENDERBUFFER:
				context.bindRenderbuffer(GL_RENDERBUFFER, fbo.getDepthStencilBuffer());
				context.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().depthStencilFormat, newWidth, newHeight);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	// Render to resized fbo
	context.viewport(0, 0, newWidth, newHeight);
	clearColorBuffer(context, colorFormat, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	context.enable(GL_DEPTH_TEST);

	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(0.0f, 0.0f, -1.0f), Vec3(+1.0f, +1.0f, 1.0f));

	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		context.enable(GL_SCISSOR_TEST);
		context.clearStencil(1);
		context.scissor(10, 10, 5, 15);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 1, 0xffu);
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	if (m_config.colorType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-0.5f, -0.5f, 0.0f), Vec3(0.5f, 0.5f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, newWidth, newHeight, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
}